

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

int __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::verify
          (btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
           *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  node_type *pnVar1;
  size_type sVar2;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *pbVar3;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *pbVar4;
  ulong uVar5;
  size_type sVar6;
  char *__function;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
  local_28;
  
  pnVar1 = (this->root_).
           super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
           .
           super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
           .
           super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
           .
           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
           ._M_head_impl;
  if (pnVar1 == (node_type *)0x0) {
    __assert_fail("root() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb45,
                  "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                 );
  }
  if (((ulong)pnVar1 & 7) == 0) {
    if (*(long *)pnVar1 == 0) {
      __assert_fail("leftmost() != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb46,
                    "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                   );
    }
    if (this->rightmost_ == (node_type *)0x0) {
      __assert_fail("rightmost_ != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb47,
                    "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                   );
    }
    sVar2 = this->size_;
    if (sVar2 != 0) {
      sVar6 = internal_verify(this,pnVar1,(key_type *)0x0,(key_type *)0x0);
      if (sVar2 != sVar6) {
        __assert_fail("empty() || size() == internal_verify(root(), nullptr, nullptr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb48,
                      "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                     );
      }
    }
    pbVar3 = (this->root_).
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
             ._M_head_impl;
    if (((ulong)pbVar3 & 7) == 0) {
      pbVar4 = *(btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 **)pbVar3;
      local_28.position = 0xffffffff;
      local_28.node = pbVar3;
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
      ::increment(&local_28);
      if (pbVar4 != local_28.node) {
        __assert_fail("leftmost() == (++const_iterator(root(), -1)).node",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb49,
                      "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                     );
      }
      pbVar3 = (this->root_).
               super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
               .
               super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
               .
               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
               .
               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
               ._M_head_impl;
      if (((ulong)pbVar3 & 7) == 0) {
        pbVar4 = this->rightmost_;
        local_28.position = (int)(byte)pbVar3[10];
        local_28.node = pbVar3;
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
        ::decrement(&local_28);
        if (pbVar4 != local_28.node) {
          __assert_fail("rightmost_ == (--const_iterator(root(), root()->count())).node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb4a,
                        "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                       );
        }
        pbVar3 = (this->root_).
                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
                 ._M_head_impl;
        if (((ulong)pbVar3 & 7) != 0) goto LAB_001ed39c;
        uVar5 = *(ulong *)pbVar3;
        if ((uVar5 & 7) == 0) {
          if (*(char *)(uVar5 + 0xb) == '\0') {
            __assert_fail("leftmost()->leaf()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb4b,
                          "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                         );
          }
          pnVar1 = this->rightmost_;
          if (((ulong)pnVar1 & 7) == 0) {
            if (pnVar1[0xb] != (node_type)0x0) {
              return (int)pnVar1;
            }
            __assert_fail("rightmost_->leaf()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb4c,
                          "void phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::verify() const [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
                         );
          }
        }
      }
      __function = 
      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
      ;
      goto LAB_001ed3c8;
    }
  }
LAB_001ed39c:
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
  ;
LAB_001ed3c8:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

const node_type *root() const { return std::get<2>(root_); }